

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_distFcnElement.cpp
# Opt level: O1

void __thiscall
amrex::LineDistFcnElement2d::single_seg_cpdist
          (LineDistFcnElement2d *this,RealVect pt,Real x0,Real x1,Real y0,Real y1,RealVect *cp,
          Real *dist)

{
  Real RVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar2 = x1 - x0;
  dVar3 = y1 - y0;
  dVar4 = ((pt.vect[0] - x0) * dVar2 + (pt.vect[1] - y0) * dVar3) / (dVar2 * dVar2 + dVar3 * dVar3);
  if (0.0 <= dVar4) {
    dVar5 = 0.0;
    if (dVar4 <= 1.0) {
      x1 = dVar2 * dVar4 + x0;
      y1 = dVar3 * dVar4 + y0;
      dVar5 = dVar4 * 0.0 + 0.0;
    }
  }
  else {
    dVar5 = 0.0;
    x1 = x0;
    y1 = y0;
  }
  cp->vect[0] = x1;
  cp->vect[1] = y1;
  cp->vect[2] = dVar5;
  dVar2 = pt.vect[0] - cp->vect[0];
  dVar3 = pt.vect[1] - cp->vect[1];
  dVar2 = dVar2 * dVar2 + dVar3 * dVar3;
  if (dVar2 < 0.0) {
    RVar1 = sqrt(dVar2);
  }
  else {
    RVar1 = SQRT(dVar2);
  }
  *dist = RVar1;
  return;
}

Assistant:

void LineDistFcnElement2d::single_seg_cpdist(amrex::RealVect pt,
                                             amrex::Real x0, amrex::Real x1,
                                             amrex::Real y0, amrex::Real y1,
                                             amrex::RealVect& cp,
                                             amrex::Real& dist) const {
  amrex::RealVect A(AMREX_D_DECL(pt[0]-x0, pt[1]-y0,0.0));
  amrex::RealVect B(AMREX_D_DECL(x1-x0, y1-y0,0.0));

  amrex::Real magBsq = B[0]*B[0] + B[1]*B[1];
  amrex::Real t =  (A[0]*B[0] + A[1]*B[1])/magBsq;

  if (t < 0) {
    cp = amrex::RealVect(AMREX_D_DECL(x0,y0,0.0));
  } else if (t > 1.0) {
    cp = amrex::RealVect(AMREX_D_DECL(x1,y1,0.0));
  } else {
    cp  = amrex::RealVect(AMREX_D_DECL(x0,y0,0.0)) + t*B;
  }

  amrex::RealVect delta = pt - cp;
  dist = sqrt(delta[0]*delta[0] + delta[1]*delta[1] );

  return;
}